

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::NoFieldPresenceSwapFieldTest
          (NoFieldPresenceSwapFieldTest *this)

{
  Reflection *pRVar1;
  Descriptor *pDVar2;
  NoFieldPresenceSwapFieldTest *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_029e0bc0;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&this->m1_);
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&this->m2_);
  pRVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetReflection();
  this->r1_ = pRVar1;
  pRVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetReflection();
  this->r2_ = pRVar1;
  pDVar2 = proto2_nofieldpresence_unittest::TestAllTypes::GetDescriptor();
  this->d1_ = pDVar2;
  pDVar2 = proto2_nofieldpresence_unittest::TestAllTypes::GetDescriptor();
  this->d2_ = pDVar2;
  return;
}

Assistant:

NoFieldPresenceSwapFieldTest()
      : m1_(),
        m2_(),
        r1_(m1_.GetReflection()),
        r2_(m2_.GetReflection()),
        d1_(m1_.GetDescriptor()),
        d2_(m2_.GetDescriptor()) {}